

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::transcode_uastc_to_etc2_eac_a8
               (unpacked_uastc_block *unpacked_src_blk,color32 (*block_pixels) [4],void *pDst)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar8 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  float fVar19;
  uint uVar21;
  undefined1 auVar20 [16];
  undefined1 in_XMM3 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM10 [16];
  undefined1 in_XMM11 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  long lVar30;
  uint uVar31;
  uint uVar37;
  uint uVar39;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar41;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar38;
  uint uVar40;
  uint uVar42;
  undefined1 auVar36 [16];
  uint32_t vals [8];
  uint local_28 [4];
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  uVar7 = unpacked_src_blk->m_mode;
  if ((ulong)uVar7 - 0x12 < 0xfffffffffffffff6 || (ulong)uVar7 == 8) {
    uVar1 = 0x1dff;
    if (uVar7 == 8) {
      uVar1 = (unpacked_src_blk->m_solid_color).field_0.field_0.a | 0x1d00;
    }
    *(ushort *)pDst = uVar1;
  }
  else {
    uVar7 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    auVar12 = pmovzxbd(in_XMM1,0xffffffff);
    lVar2 = 0;
    do {
      auVar22 = ZEXT416(CONCAT13((*block_pixels)[lVar2 + 3].field_0.field_0.a,
                                 CONCAT12((*block_pixels)[lVar2 + 2].field_0.field_0.a,
                                          CONCAT11((*block_pixels)[lVar2 + 1].field_0.field_0.a,
                                                   (*block_pixels)[lVar2].field_0.field_0.a))));
      auVar20 = pmovzxbd(auVar22,auVar22);
      uVar18 = auVar20._0_4_;
      uVar21 = auVar12._0_4_;
      auVar22._0_4_ = (uVar18 < uVar21) * uVar18 | (uVar18 >= uVar21) * uVar21;
      uVar21 = auVar20._4_4_;
      uVar37 = auVar12._4_4_;
      auVar22._4_4_ = (uVar21 < uVar37) * uVar21 | (uVar21 >= uVar37) * uVar37;
      uVar37 = auVar20._8_4_;
      uVar39 = auVar12._8_4_;
      uVar41 = auVar12._12_4_;
      auVar22._8_4_ = (uVar37 < uVar39) * uVar37 | (uVar37 >= uVar39) * uVar39;
      uVar39 = auVar20._12_4_;
      auVar22._12_4_ = (uVar39 < uVar41) * uVar39 | (uVar39 >= uVar41) * uVar41;
      uVar7 = (uVar7 < uVar18) * uVar18 | (uVar7 >= uVar18) * uVar7;
      uVar9 = (uVar9 < uVar21) * uVar21 | (uVar9 >= uVar21) * uVar9;
      uVar10 = (uVar10 < uVar37) * uVar37 | (uVar10 >= uVar37) * uVar10;
      uVar11 = (uVar11 < uVar39) * uVar39 | (uVar11 >= uVar39) * uVar11;
      lVar2 = lVar2 + 4;
      auVar12 = auVar22;
    } while (lVar2 != 0x10);
    uVar18 = (auVar22._0_4_ < auVar22._8_4_) * auVar22._0_4_ |
             (auVar22._0_4_ >= auVar22._8_4_) * auVar22._8_4_;
    uVar21 = (auVar22._4_4_ < auVar22._12_4_) * auVar22._4_4_ |
             (auVar22._4_4_ >= auVar22._12_4_) * auVar22._12_4_;
    uVar18 = (uVar18 < uVar21) * uVar18 | (uVar18 >= uVar21) * uVar21;
    uVar7 = (uVar10 < uVar7) * uVar7 | (uVar10 >= uVar7) * uVar10;
    uVar9 = (uVar11 < uVar9) * uVar9 | (uVar11 >= uVar9) * uVar11;
    uVar7 = (uVar9 < uVar7) * uVar7 | (uVar9 >= uVar7) * uVar9;
    if (uVar18 != uVar7) {
      uVar9 = unpacked_src_blk->m_etc2_hints;
      if (0xf < uVar9) {
        lVar2 = (ulong)(uVar9 & 0xf) * 8;
        iVar6 = (int)*(char *)((long)&DAT_0027fb01 + lVar2 + 2);
        auVar33._4_12_ = in_XMM3._4_12_;
        auVar33._0_4_ = (float)-iVar6 / (float)((char)(&DAT_0027fb07)[lVar2] - iVar6);
        fVar19 = ((float)(int)uVar7 - (float)(int)uVar18) * auVar33._0_4_ + (float)(int)uVar18;
        auVar12 = ZEXT416((uint)fVar19 & 0x80000000) | _DAT_0027d8c0;
        auVar12._0_4_ = auVar12._0_4_ + fVar19;
        auVar12 = roundss(auVar12,auVar12,0xb);
        iVar6 = (int)auVar12._0_4_;
        *(ushort *)pDst = (ushort)iVar6 & 0xff | (ushort)(uVar9 << 8);
        auVar20._0_4_ = uVar9 >> 4;
        auVar20._4_4_ = uVar9 >> 4;
        auVar20._8_4_ = uVar9 >> 4;
        auVar20._12_4_ = uVar9 >> 4;
        lVar4 = 0;
        auVar12 = pmovzxbd(auVar33,0xffffffff);
        do {
          auVar22 = pmovsxbd(in_XMM5,*(undefined4 *)(&g_eac_modifier_table + lVar4 + lVar2));
          auVar22 = pmulld(auVar22,auVar20);
          in_XMM5._0_4_ = auVar22._0_4_ + iVar6;
          in_XMM5._4_4_ = auVar22._4_4_ + iVar6;
          in_XMM5._8_4_ = auVar22._8_4_ + iVar6;
          in_XMM5._12_4_ = auVar22._12_4_ + iVar6;
          uVar7 = auVar12._0_4_;
          uVar9 = auVar12._4_4_;
          uVar10 = auVar12._8_4_;
          uVar11 = auVar12._12_4_;
          auVar8._0_4_ = -(uint)(((uVar7 < in_XMM5._0_4_) * uVar7 |
                                 (uVar7 >= in_XMM5._0_4_) * in_XMM5._0_4_) == in_XMM5._0_4_);
          auVar8._4_4_ = -(uint)(((uVar9 < in_XMM5._4_4_) * uVar9 |
                                 (uVar9 >= in_XMM5._4_4_) * in_XMM5._4_4_) == in_XMM5._4_4_);
          auVar8._8_4_ = -(uint)(((uVar10 < in_XMM5._8_4_) * uVar10 |
                                 (uVar10 >= in_XMM5._8_4_) * in_XMM5._8_4_) == in_XMM5._8_4_);
          auVar8._12_4_ =
               -(uint)(((uVar11 < in_XMM5._12_4_) * uVar11 |
                       (uVar11 >= in_XMM5._12_4_) * in_XMM5._12_4_) == in_XMM5._12_4_);
          auVar23._0_4_ = -(uint)(-1 < (int)in_XMM5._0_4_);
          auVar23._4_4_ = -(uint)(-1 < (int)in_XMM5._4_4_);
          auVar23._8_4_ = -(uint)(-1 < (int)in_XMM5._8_4_);
          auVar23._12_4_ = -(uint)(-1 < (int)in_XMM5._12_4_);
          auVar22 = blendvps(auVar23,in_XMM5,auVar8);
          local_28[lVar4] = auVar22._0_4_ & uVar7;
          local_28[lVar4 + 1] = auVar22._4_4_ & uVar9;
          local_28[lVar4 + 2] = auVar22._8_4_ & uVar10;
          local_28[lVar4 + 3] = auVar22._12_4_ & uVar11;
          lVar4 = lVar4 + 4;
        } while (lVar4 != 8);
        auVar12 = (undefined1  [16])0x0;
        auVar24 = pmovsxbq(in_XMM9,0x100);
        lVar2 = 0;
        auVar22 = pmovsxbd(in_XMM10,0x7070707);
        auVar20 = pmovsxbq(in_XMM11,0x2d2d);
        do {
          uVar3 = (ulong)(((uint)lVar2 & 2) << 4);
          uVar5 = (ulong)((uint)lVar2 & 0xfffffffc);
          uVar7 = (uint)(*block_pixels)[0].field_0.c[uVar5 + uVar3 + 3];
          auVar32._0_4_ = local_28[0] - uVar7;
          uVar29 = (uint)block_pixels[1][0].field_0.c[uVar5 + uVar3 + 3];
          auVar32._4_4_ = local_28[0] - uVar29;
          auVar32._8_4_ = local_28[1];
          auVar32._12_4_ = local_28[1];
          auVar33 = pabsd(auVar32,auVar32);
          uVar21 = auVar33._0_4_ * 8;
          uVar37 = auVar33._4_4_ * 8;
          uVar39 = auVar33._8_4_ * 8;
          uVar41 = auVar33._12_4_ * 8;
          auVar13._0_4_ = local_28[1] - uVar7;
          auVar13._4_4_ = local_28[1] - uVar29;
          auVar13._8_4_ = local_28[2];
          auVar13._12_4_ = local_28[2];
          auVar33 = pabsd(auVar13,auVar13);
          uVar11 = auVar33._8_4_ * 8;
          uVar18 = auVar33._12_4_ * 8;
          uVar9 = auVar33._0_4_ << 3 | 1;
          uVar10 = auVar33._4_4_ << 3 | 1;
          uVar9 = (uVar21 < uVar9) * uVar21 | (uVar21 >= uVar9) * uVar9;
          uVar10 = (uVar37 < uVar10) * uVar37 | (uVar37 >= uVar10) * uVar10;
          uVar11 = (uVar39 < uVar11) * uVar39 | (uVar39 >= uVar11) * uVar11;
          uVar18 = (uVar41 < uVar18) * uVar41 | (uVar41 >= uVar18) * uVar18;
          auVar34._0_4_ = local_28[2] - uVar7;
          auVar34._4_4_ = local_28[2] - uVar29;
          auVar34._8_4_ = local_28[3];
          auVar34._12_4_ = local_28[3];
          auVar33 = pabsd(in_XMM12,auVar34);
          uVar39 = auVar33._8_4_ * 8;
          uVar41 = auVar33._12_4_ * 8;
          uVar21 = auVar33._0_4_ << 3 | 2;
          uVar37 = auVar33._4_4_ << 3 | 2;
          auVar35._0_4_ = local_28[3] - uVar7;
          auVar35._4_4_ = local_28[3] - uVar29;
          auVar35._8_4_ = local_18;
          auVar35._12_4_ = local_18;
          auVar33 = pabsd(auVar35,auVar35);
          uVar40 = auVar33._8_4_ * 8;
          uVar42 = auVar33._12_4_ * 8;
          uVar31 = auVar33._0_4_ << 3 | 3;
          uVar38 = auVar33._4_4_ << 3 | 3;
          uVar21 = (uVar21 < uVar31) * uVar21 | (uVar21 >= uVar31) * uVar31;
          uVar37 = (uVar37 < uVar38) * uVar37 | (uVar37 >= uVar38) * uVar38;
          uVar39 = (uVar39 < uVar40) * uVar39 | (uVar39 >= uVar40) * uVar40;
          uVar41 = (uVar41 < uVar42) * uVar41 | (uVar41 >= uVar42) * uVar42;
          uVar31 = (uVar9 < uVar21) * uVar9 | (uVar9 >= uVar21) * uVar21;
          uVar38 = (uVar10 < uVar37) * uVar10 | (uVar10 >= uVar37) * uVar37;
          uVar40 = (uVar11 < uVar39) * uVar11 | (uVar11 >= uVar39) * uVar39;
          uVar42 = (uVar18 < uVar41) * uVar18 | (uVar18 >= uVar41) * uVar41;
          auVar14._0_4_ = local_18 - uVar7;
          auVar14._4_4_ = local_18 - uVar29;
          auVar14._8_4_ = iStack_14;
          auVar14._12_4_ = iStack_14;
          auVar33 = pabsd(auVar14,auVar14);
          uVar11 = auVar33._8_4_ * 8;
          uVar18 = auVar33._12_4_ * 8;
          uVar9 = auVar33._0_4_ << 3 | 4;
          uVar10 = auVar33._4_4_ << 3 | 4;
          auVar25._0_4_ = iStack_14 - uVar7;
          auVar25._4_4_ = iStack_14 - uVar29;
          auVar25._8_4_ = iStack_14;
          auVar25._12_4_ = iStack_14;
          auVar33 = pabsd(auVar25,auVar25);
          uVar39 = auVar33._8_4_ * 8;
          uVar41 = auVar33._12_4_ * 8;
          uVar21 = auVar33._0_4_ << 3 | 5;
          uVar37 = auVar33._4_4_ << 3 | 5;
          uVar21 = (uVar9 < uVar21) * uVar9 | (uVar9 >= uVar21) * uVar21;
          uVar37 = (uVar10 < uVar37) * uVar10 | (uVar10 >= uVar37) * uVar37;
          uVar39 = (uVar11 < uVar39) * uVar11 | (uVar11 >= uVar39) * uVar39;
          uVar41 = (uVar18 < uVar41) * uVar18 | (uVar18 >= uVar41) * uVar41;
          auVar15._0_4_ = iStack_10 - uVar7;
          auVar15._4_4_ = iStack_10 - uVar29;
          auVar15._8_4_ = iStack_10;
          auVar15._12_4_ = iStack_10;
          auVar33 = pabsd(auVar15,auVar15);
          uVar11 = auVar33._8_4_ * 8;
          uVar18 = auVar33._12_4_ * 8;
          uVar9 = auVar33._0_4_ << 3 | 6;
          uVar10 = auVar33._4_4_ << 3 | 6;
          uVar9 = (uVar21 < uVar9) * uVar21 | (uVar21 >= uVar9) * uVar9;
          uVar10 = (uVar37 < uVar10) * uVar37 | (uVar37 >= uVar10) * uVar10;
          uVar11 = (uVar39 < uVar11) * uVar39 | (uVar39 >= uVar11) * uVar11;
          uVar18 = (uVar41 < uVar18) * uVar41 | (uVar41 >= uVar18) * uVar18;
          auVar16._0_4_ = (uVar31 < uVar9) * uVar31 | (uVar31 >= uVar9) * uVar9;
          auVar16._4_4_ = (uVar38 < uVar10) * uVar38 | (uVar38 >= uVar10) * uVar10;
          auVar16._8_4_ = (uVar40 < uVar11) * uVar40 | (uVar40 >= uVar11) * uVar11;
          auVar16._12_4_ = (uVar42 < uVar18) * uVar42 | (uVar42 >= uVar18) * uVar18;
          auVar26._0_4_ = iStack_c - uVar7;
          auVar26._4_4_ = iStack_c - uVar29;
          auVar26._8_4_ = iStack_c;
          auVar26._12_4_ = iStack_c;
          auVar33 = pabsd(auVar26,auVar26);
          auVar27._0_4_ = auVar33._0_4_ << 3;
          auVar27._4_4_ = auVar33._4_4_ << 3;
          auVar27._8_4_ = auVar33._8_4_ << 3;
          auVar27._12_4_ = auVar33._12_4_ << 3;
          auVar27 = auVar27 | auVar22;
          uVar7 = auVar27._0_4_;
          auVar28._0_4_ = (auVar16._0_4_ < uVar7) * auVar16._0_4_ | (auVar16._0_4_ >= uVar7) * uVar7
          ;
          uVar7 = auVar27._4_4_;
          auVar28._4_4_ = (auVar16._4_4_ < uVar7) * auVar16._4_4_ | (auVar16._4_4_ >= uVar7) * uVar7
          ;
          uVar7 = auVar27._8_4_;
          uVar9 = auVar27._12_4_;
          auVar28._8_4_ = (auVar16._8_4_ < uVar7) * auVar16._8_4_ | (auVar16._8_4_ >= uVar7) * uVar7
          ;
          auVar28._12_4_ =
               (auVar16._12_4_ < uVar9) * auVar16._12_4_ | (auVar16._12_4_ >= uVar9) * uVar9;
          auVar33 = pmovzxdq(auVar16,auVar28 & auVar22);
          lVar4 = auVar24._8_8_;
          lVar30 = auVar20._8_8_ + lVar4 * -3;
          in_XMM12._8_4_ = (int)lVar30;
          in_XMM12._0_8_ = lVar30;
          in_XMM12._12_4_ = (int)((ulong)lVar30 >> 0x20);
          auVar36._0_8_ = auVar33._0_8_ << lVar30;
          auVar36._8_8_ = auVar33._8_8_ << in_XMM12._8_8_;
          auVar17._0_8_ = auVar33._0_8_ << auVar20._0_8_ + auVar24._0_8_ * -3;
          auVar17._8_8_ = auVar33._8_8_ << lVar30;
          auVar33 = pblendw(auVar17,auVar36,0xf0);
          auVar12 = auVar12 | auVar33;
          lVar2 = lVar2 + 2;
          auVar24._0_8_ = auVar24._0_8_ + 2;
          auVar24._8_8_ = lVar4 + 2;
        } while (lVar2 != 0x10);
        uVar3 = auVar12._8_8_ | auVar12._0_8_;
        *(char *)((long)pDst + 2) = (char)(uVar3 >> 0x28);
        *(char *)((long)pDst + 3) = (char)(uVar3 >> 0x20);
        *(char *)((long)pDst + 4) = (char)(uVar3 >> 0x18);
        *(char *)((long)pDst + 5) = (char)(uVar3 >> 0x10);
        *(char *)((long)pDst + 6) = (char)(uVar3 >> 8);
        *(char *)((long)pDst + 7) = (char)uVar3;
        return;
      }
      __assert_fail("multiplier >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x38ba,
                    "void basist::transcode_uastc_to_etc2_eac_a8(unpacked_uastc_block &, color32 (*)[4], void *)"
                   );
    }
    *(ushort *)pDst = (ushort)uVar18 | 0x1d00;
  }
  *(undefined4 *)((long)pDst + 2) = 0x92244992;
  *(undefined2 *)((long)pDst + 6) = 0x2449;
  return;
}

Assistant:

void transcode_uastc_to_etc2_eac_a8(unpacked_uastc_block& unpacked_src_blk, color32 block_pixels[4][4], void* pDst)
	{
		eac_block& dst = *static_cast<eac_block*>(pDst);
		const color32* pSrc_pixels = &block_pixels[0][0];

		if ((!g_uastc_mode_has_alpha[unpacked_src_blk.m_mode]) || (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR))
		{
			const uint32_t a = (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR) ? unpacked_src_blk.m_solid_color[3] : 255;

			dst.m_base = a;
			dst.m_table = 13;
			dst.m_multiplier = 1;

			memcpy(dst.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));

			return;
		}

		uint32_t min_a = 255, max_a = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			min_a = basisu::minimum<uint32_t>(min_a, pSrc_pixels[i].a);
			max_a = basisu::maximum<uint32_t>(max_a, pSrc_pixels[i].a);
		}

		if (min_a == max_a)
		{
			dst.m_base = min_a;
			dst.m_table = 13;
			dst.m_multiplier = 1;

			memcpy(dst.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));
			return;
		}

		const uint32_t table = unpacked_src_blk.m_etc2_hints & 0xF;
		const int multiplier = unpacked_src_blk.m_etc2_hints >> 4;

		assert(multiplier >= 1);

		dst.m_multiplier = multiplier;
		dst.m_table = table;

		const float range = (float)(g_eac_modifier_table[dst.m_table][ETC2_EAC_MAX_VALUE_SELECTOR] - g_eac_modifier_table[dst.m_table][ETC2_EAC_MIN_VALUE_SELECTOR]);
		const int center = (int)roundf(basisu::lerp((float)min_a, (float)max_a, (float)(0 - g_eac_modifier_table[dst.m_table][ETC2_EAC_MIN_VALUE_SELECTOR]) / range));

		dst.m_base = center;

		const int8_t* pTable = &g_eac_modifier_table[dst.m_table][0];

		uint32_t vals[8];
		for (uint32_t j = 0; j < 8; j++)
			vals[j] = clamp255(center + (pTable[j] * multiplier));

		uint64_t sels = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t a = block_pixels[i & 3][i >> 2].a;

			const uint32_t err0 = (basisu::iabs(vals[0] - a) << 3) | 0;
			const uint32_t err1 = (basisu::iabs(vals[1] - a) << 3) | 1;
			const uint32_t err2 = (basisu::iabs(vals[2] - a) << 3) | 2;
			const uint32_t err3 = (basisu::iabs(vals[3] - a) << 3) | 3;
			const uint32_t err4 = (basisu::iabs(vals[4] - a) << 3) | 4;
			const uint32_t err5 = (basisu::iabs(vals[5] - a) << 3) | 5;
			const uint32_t err6 = (basisu::iabs(vals[6] - a) << 3) | 6;
			const uint32_t err7 = (basisu::iabs(vals[7] - a) << 3) | 7;

			const uint32_t min_err = basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(err0, err1, err2), err3), err4), err5), err6), err7);

			const uint64_t best_index = min_err & 7;
			sels |= (best_index << (45 - i * 3));
		}

		dst.set_selector_bits(sels);
	}